

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall
HighsSimplexAnalysis::reportRunTime(HighsSimplexAnalysis *this,bool header,double run_time)

{
  type pbVar1;
  byte in_SIL;
  double in_XMM0_Qa;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  string local_38 [32];
  double local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 == 0) {
    local_18 = in_XMM0_Qa;
    pbVar1 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(in_stack_ffffffffffffffa0);
    pbVar1 = pbVar1 + 0x10;
    highsFormatToString_abi_cxx11_((char *)local_38," %ds",(ulong)(uint)(int)(local_18 + 0.49));
    std::operator<<((ostream *)pbVar1,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportRunTime(const bool header,
                                         const double run_time) {
  if (header) return;
#ifndef NDEBUG
  *analysis_log << highsFormatToString(" %15.8gs", run_time);
#else
  *analysis_log << highsFormatToString(" %ds", int(run_time + 0.49));
#endif
}